

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegalizeJSInterface.cpp
# Opt level: O1

void __thiscall
wasm::anon_unknown_0::LegalizeJSInterface::run(LegalizeJSInterface *this,Module *module)

{
  undefined8 *puVar1;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  Function **ppFVar2;
  pointer puVar3;
  uintptr_t uVar4;
  long lVar5;
  pointer puVar6;
  PassRunner *pPVar7;
  pointer puVar8;
  Global *pGVar9;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> _Var10;
  pointer ppEVar11;
  pointer puVar12;
  _Head_base<0UL,_wasm::DataSegment_*,_false> _Var13;
  pointer pTVar14;
  pointer ppFVar15;
  __single_object _Var16;
  bool bVar17;
  bool bVar18;
  Index IVar19;
  Function *pFVar20;
  long *plVar21;
  Function *pFVar22;
  char *pcVar23;
  Block *value;
  size_t sVar24;
  Type *pTVar25;
  Expression *pEVar26;
  Block *this_01;
  LocalSet *item;
  Export *pEVar27;
  Call *pCVar28;
  undefined8 *puVar29;
  _Head_base<0UL,_wasm::Function_*,_false> _Var30;
  Module *pMVar31;
  mapped_type __s;
  mapped_type *ppFVar32;
  variant<wasm::Name,_wasm::HeapType> *pvVar33;
  char *pcVar34;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *ex;
  undefined1 auVar35 [8];
  __node_base *p_Var36;
  pointer puVar37;
  Type TVar38;
  Type in_R9;
  pointer ppEVar39;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  string_view *psVar40;
  HeapType *pHVar41;
  Type TVar42;
  MixedArena *pMVar43;
  ExpressionList *this_02;
  pointer ppFVar44;
  pointer puVar45;
  pointer puVar46;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar47;
  string_view sVar48;
  Signature SVar49;
  Name name;
  Name name_00;
  initializer_list<wasm::Expression_*> __l;
  optional<wasm::Type> type_;
  string_view sVar50;
  string_view s;
  string_view s_00;
  Name name_01;
  Name name_02;
  Signature sig;
  Name name_03;
  Name name_04;
  Name name_05;
  Name name_06;
  undefined1 auStack_268 [8];
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  newExports;
  undefined1 auStack_248 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> legalParams;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [3];
  bool local_1f8;
  undefined1 local_1f0 [200];
  Function *pFStack_128;
  _Storage<wasm::Function::DebugLocation,_true> local_120;
  Type local_108;
  string_view *local_100;
  undefined1 auStack_f8 [8];
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> originalFunctions;
  _Head_base<0UL,_wasm::Function_*,_false> local_a8;
  __single_object stub;
  Type local_98;
  Builder builder_1;
  __single_object legalIm;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  Builder builder;
  undefined1 local_70 [24];
  undefined1 auStack_58 [8];
  size_type __dnew;
  string_view local_48;
  
  this->getTempRet0 = (Function *)0x0;
  this->setTempRet0 = (Function *)0x0;
  auStack_248 = (undefined1  [8])
                &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_finish;
  auStack_58 = (undefined1  [8])0x26;
  auStack_248 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)auStack_248,(ulong)auStack_58);
  legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auStack_58;
  builtin_strncpy((char *)auStack_248,"legalize-js-interface-export-originals",0x26);
  legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auStack_58;
  *(char *)((long)auStack_248 + (long)auStack_58) = '\0';
  bVar17 = Pass::hasArgument(&this->super_Pass,(string *)auStack_248);
  if (auStack_248 !=
      (undefined1  [8])
      &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete((void *)auStack_248,
                    (ulong)((long)&(legalParams.
                                    super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish)->id + 1));
  }
  auStack_248 = (undefined1  [8])
                &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_finish;
  auStack_58 = (undefined1  [8])0x26;
  auStack_248 = (undefined1  [8])
                std::__cxx11::string::_M_create((ulong *)auStack_248,(ulong)auStack_58);
  pcVar23 = auStack_248;
  legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auStack_58;
  (((Function *)auStack_248)->super_Importable).super_Named.hasExplicitName = true;
  (((Function *)auStack_248)->super_Importable).super_Named.field_0x11 = 'f';
  (((Function *)auStack_248)->super_Importable).super_Named.field_0x12 = 'a';
  (((Function *)auStack_248)->super_Importable).super_Named.field_0x13 = 'c';
  (((Function *)auStack_248)->super_Importable).super_Named.field_0x14 = 'e';
  (((Function *)auStack_248)->super_Importable).super_Named.field_0x15 = '-';
  (((Function *)auStack_248)->super_Importable).super_Named.field_0x16 = 'e';
  (((Function *)auStack_248)->super_Importable).super_Named.field_0x17 = 'x';
  (((Function *)auStack_248)->super_Importable).module.super_IString.str._M_len = 0x682d646574726f70
  ;
  (((Function *)auStack_248)->super_Importable).super_Named.name.super_IString.str._M_len =
       0x657a696c6167656c;
  (((Function *)auStack_248)->super_Importable).super_Named.name.super_IString.str._M_str =
       (char *)0x65746e692d736a2d;
  *(undefined8 *)
   ((long)&(((Function *)auStack_248)->super_Importable).module.super_IString.str._M_len + 6) =
       0x737265706c65682d;
  legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auStack_58;
  *(char *)((long)&(((Function *)auStack_248)->super_Importable).super_Named.name.super_IString.str.
                   _M_len + (long)auStack_58) = '\0';
  bVar18 = Pass::hasArgument(&this->super_Pass,(string *)pcVar23);
  this->exportedHelpers = bVar18;
  if (auStack_248 !=
      (undefined1  [8])
      &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    pcVar23 = (char *)((long)&(legalParams.
                               super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                               super__Vector_impl_data._M_finish)->id + 1);
    operator_delete((void *)auStack_248,(ulong)pcVar23);
  }
  auStack_268 = (undefined1  [8])0x0;
  newExports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  newExports.
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  _Var30._M_head_impl =
       (Function *)
       (module->exports).
       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)(module->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  auVar35 = auStack_268;
  local_70._16_8_ = module;
  pFVar20 = (Function *)
            newExports.
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (_Var30._M_head_impl !=
      (Function *)
      originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    newExports.
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&module->allocator;
    do {
      pEVar27 = (((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> *)
                 &(_Var30._M_head_impl)->super_Importable)->
                super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)._M_t.
                super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      stub._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
           (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)_Var30;
      if (pEVar27->kind == Function) {
        psVar40 = (string_view *)&pEVar27->value;
        if (*(__index_type *)
             ((long)&(pEVar27->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) !=
            '\0') {
          psVar40 = (string_view *)0x0;
        }
        pcVar23 = (char *)psVar40->_M_len;
        pFVar20 = Module::getFunction(module,(Name)*psVar40);
        bVar18 = isIllegal<wasm::Function>((LegalizeJSInterface *)pFVar20,(Function *)pcVar23);
        if (bVar18) {
          local_48._M_len = 0x7574736c6167656c;
          __dnew = 10;
          local_48._M_str._0_4_ = CONCAT13(local_48._M_str._3_1_,0x2462);
          pcVar23 = (pFVar20->super_Importable).super_Named.name.super_IString.str._M_str;
          local_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70;
          auStack_58 = (undefined1  [8])&local_48;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xffffffffffffff80,pcVar23,
                     pcVar23 + (pFVar20->super_Importable).super_Named.name.super_IString.str._M_len
                    );
          puVar37 = (pointer)0xf;
          if (auStack_58 != (undefined1  [8])&local_48) {
            puVar37 = (pointer)local_48._M_len;
          }
          puVar3 = (pointer)((long)&((builder.wasm)->exports).
                                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + __dnew);
          TVar38.id = __dnew;
          local_100 = psVar40;
          if (puVar37 < puVar3) {
            puVar37 = (pointer)0xf;
            if ((Module *)local_80._M_pi != (Module *)local_70) {
              puVar37 = (pointer)local_70._0_8_;
            }
            if (puVar37 < puVar3) goto LAB_0092782a;
            plVar21 = (long *)std::__cxx11::string::replace
                                        ((ulong)&stack0xffffffffffffff80,0,(char *)0x0,
                                         (ulong)auStack_58);
          }
          else {
LAB_0092782a:
            plVar21 = (long *)std::__cxx11::string::_M_append(auStack_58,(ulong)local_80._M_pi);
          }
          auStack_248 = (undefined1  [8])
                        &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
          pFVar22 = (Function *)(plVar21 + 2);
          if ((Function *)*plVar21 == pFVar22) {
            legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)(pFVar22->super_Importable).super_Named.name.super_IString.str._M_len;
            legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)plVar21[3];
          }
          else {
            legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)(pFVar22->super_Importable).super_Named.name.super_IString.str._M_len;
            auStack_248 = (undefined1  [8])*plVar21;
          }
          legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)plVar21[1];
          *plVar21 = (long)pFVar22;
          plVar21[1] = 0;
          *(undefined1 *)&(pFVar22->super_Importable).super_Named.name.super_IString.str._M_len = 0;
          sVar48._M_str = (char *)0x0;
          sVar48._M_len = (size_t)auStack_248;
          sVar48 = IString::interned((IString *)
                                     legalParams.
                                     super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                     _M_impl.super__Vector_impl_data._M_start,sVar48,
                                     SUB81(pFVar22,0));
          pcVar23 = (char *)sVar48._M_len;
          if (auStack_248 !=
              (undefined1  [8])
              &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_finish) {
            operator_delete((void *)auStack_248,
                            (ulong)((long)&(legalParams.
                                            super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                            ._M_impl.super__Vector_impl_data._M_finish)->id + 1));
          }
          if ((Module *)local_80._M_pi != (Module *)local_70) {
            operator_delete(local_80._M_pi,
                            (ulong)((long)&(((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>
                                              *)local_70._0_8_)->
                                           super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                           )._M_t.
                                           super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                           .super__Head_base<0UL,_wasm::Export_*,_false>.
                                           _M_head_impl + 1));
          }
          if (auStack_58 != (undefined1  [8])&local_48) {
            operator_delete((void *)auStack_58,
                            (ulong)((long)&(((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>
                                              *)local_48._M_len)->
                                           super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                           )._M_t.
                                           super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                           .super__Head_base<0UL,_wasm::Export_*,_false>.
                                           _M_head_impl + 1));
          }
          pFVar22 = Module::getFunctionOrNull((Module *)local_70._16_8_,(Name)sVar48);
          if (pFVar22 == (Function *)0x0) {
            local_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._16_8_;
            pcVar23 = (char *)operator_new(0x1d8);
            memset(pcVar23,0,0x1d8);
            HeapType::HeapType(&((Function *)pcVar23)->type,(Signature)ZEXT816(0));
            ((Function *)pcVar23)->profile = Normal;
            (((Function *)pcVar23)->vars).
            super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (((Function *)pcVar23)->vars).
            super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (((Function *)pcVar23)->vars).
            super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ((Function *)pcVar23)->body = (Expression *)0x0;
            (((Function *)pcVar23)->localNames)._M_h._M_buckets =
                 &(((Function *)pcVar23)->localNames)._M_h._M_single_bucket;
            (((Function *)pcVar23)->localNames)._M_h._M_bucket_count = 1;
            (((Function *)pcVar23)->localNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0
            ;
            (((Function *)pcVar23)->localNames)._M_h._M_element_count = 0;
            (((Function *)pcVar23)->localNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            (((Function *)pcVar23)->localNames)._M_h._M_rehash_policy._M_next_resize = 0;
            (((Function *)pcVar23)->localNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
            (((Function *)pcVar23)->localIndices)._M_h._M_buckets =
                 &(((Function *)pcVar23)->localIndices)._M_h._M_single_bucket;
            (((Function *)pcVar23)->localIndices)._M_h._M_bucket_count = 1;
            (((Function *)pcVar23)->localIndices)._M_h._M_before_begin._M_nxt =
                 (_Hash_node_base *)0x0;
            (((Function *)pcVar23)->localIndices)._M_h._M_element_count = 0;
            (((Function *)pcVar23)->localIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            (((Function *)pcVar23)->localIndices)._M_h._M_rehash_policy._M_next_resize = 0;
            (((Function *)pcVar23)->localIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
            (((Function *)pcVar23)->debugLocations)._M_h._M_buckets =
                 &(((Function *)pcVar23)->debugLocations)._M_h._M_single_bucket;
            (((Function *)pcVar23)->debugLocations)._M_h._M_bucket_count = 1;
            (((Function *)pcVar23)->debugLocations)._M_h._M_before_begin._M_nxt =
                 (_Hash_node_base *)0x0;
            (((Function *)pcVar23)->debugLocations)._M_h._M_element_count = 0;
            (((Function *)pcVar23)->debugLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            (((Function *)pcVar23)->debugLocations)._M_h._M_rehash_policy._M_next_resize = 0;
            (((Function *)pcVar23)->debugLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
            (((Function *)pcVar23)->prologLocation).
            super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
            (((Function *)pcVar23)->epilogLocation).
            super__Optional_base<wasm::Function::DebugLocation,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
            (((Function *)pcVar23)->expressionLocations)._M_h._M_buckets =
                 &(((Function *)pcVar23)->expressionLocations)._M_h._M_single_bucket;
            (((Function *)pcVar23)->expressionLocations)._M_h._M_bucket_count = 1;
            (((Function *)pcVar23)->expressionLocations)._M_h._M_before_begin._M_nxt =
                 (_Hash_node_base *)0x0;
            (((Function *)pcVar23)->expressionLocations)._M_h._M_element_count = 0;
            (((Function *)pcVar23)->expressionLocations)._M_h._M_rehash_policy._M_max_load_factor =
                 1.0;
            (((Function *)pcVar23)->expressionLocations)._M_h._M_rehash_policy._M_next_resize = 0;
            (((Function *)pcVar23)->expressionLocations)._M_h._M_single_bucket =
                 (__node_base_ptr)0x0;
            (((Function *)pcVar23)->delimiterLocations)._M_h._M_buckets =
                 &(((Function *)pcVar23)->delimiterLocations)._M_h._M_single_bucket;
            (((Function *)pcVar23)->delimiterLocations)._M_h._M_bucket_count = 1;
            (((Function *)pcVar23)->delimiterLocations)._M_h._M_before_begin._M_nxt =
                 (_Hash_node_base *)0x0;
            (((Function *)pcVar23)->delimiterLocations)._M_h._M_element_count = 0;
            (((Function *)pcVar23)->delimiterLocations)._M_h._M_rehash_policy._M_max_load_factor =
                 1.0;
            *(undefined8 *)
             ((long)&(((Function *)pcVar23)->delimiterLocations)._M_h._M_single_bucket + 4) = 0;
            (((Function *)pcVar23)->funcLocation).declarations = 0;
            (((Function *)pcVar23)->funcLocation).end = 0;
            (((Function *)pcVar23)->delimiterLocations)._M_h._M_rehash_policy._M_next_resize = 0;
            (((Function *)pcVar23)->delimiterLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0
            ;
            (((Function *)pcVar23)->effects).
            super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            (((Function *)pcVar23)->effects).
            super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            ((Function *)pcVar23)->noFullInline = false;
            ((Function *)pcVar23)->noPartialInline = false;
            (((Function *)pcVar23)->super_Importable).super_Named.name.super_IString.str = sVar48;
            (((Function *)pcVar23)->super_Importable).super_Named.hasExplicitName = true;
            value = (Block *)MixedArena::allocSpace
                                       ((MixedArena *)
                                        newExports.
                                        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,0x48,8);
            (value->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = CallId
            ;
            (value->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
            (value->name).super_IString.str._M_len = 0;
            (value->name).super_IString.str._M_str = (char *)0x0;
            (value->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
            .data = (Expression **)0x0;
            (value->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
            .usedElements =
                 (size_t)newExports.
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (value->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
            .allocatedElements = 0;
            (value->list).allocator = (MixedArena *)0x0;
            value[1].super_SpecificExpression<(wasm::Expression::Id)1>.super_Expression._id =
                 InvalidId;
            pMVar43 = (MixedArena *)
                      (pFVar20->super_Importable).super_Named.name.super_IString.str._M_str;
            (value->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
            .allocatedElements =
                 (pFVar20->super_Importable).super_Named.name.super_IString.str._M_len;
            (value->list).allocator = pMVar43;
            pHVar41 = &pFVar20->type;
            SVar49 = HeapType::getSignature(pHVar41);
            (value->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id =
                 SVar49.results.id.id;
            auStack_248 = (undefined1  [8])0x0;
            legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            SVar49 = HeapType::getSignature(pHVar41);
            auStack_f8 = (undefined1  [8])SVar49.params.id;
            __dnew = 0;
            auStack_58 = (undefined1  [8])auStack_f8;
            sVar24 = wasm::Type::size((Type *)auStack_f8);
            if ((__dnew != sVar24) || (auStack_58 != (undefined1  [8])auStack_f8)) {
              do {
                pTVar25 = wasm::Type::Iterator::operator*((Iterator *)auStack_58);
                pTVar14 = legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                auVar35 = auStack_248;
                uVar4 = pTVar25->id;
                if (uVar4 == 3) {
                  IVar19 = (Index)((ulong)((long)legalParams.
                                                 super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                                 ._M_impl.super__Vector_impl_data._M_start -
                                          (long)auStack_248) >> 3);
                  pEVar26 = I64Utilities::recreateI64
                                      ((Builder *)&stack0xffffffffffffff80,IVar19,IVar19 + 1);
                  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )&value->name,pEVar26);
                  local_98.id = 2;
                  if (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start ==
                      legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::
                    _M_realloc_insert<wasm::Type>
                              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_248,
                               (iterator)
                               legalParams.
                               super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                               super__Vector_impl_data._M_start,&local_98);
                  }
                  else {
                    (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                     .super__Vector_impl_data._M_start)->id = 2;
                    legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                         _M_impl.super__Vector_impl_data._M_start + 1;
                  }
                  local_98.id = 2;
                  if (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start ==
                      legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::
                    _M_realloc_insert<wasm::Type>
                              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_248,
                               (iterator)
                               legalParams.
                               super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                               super__Vector_impl_data._M_start,&local_98);
                  }
                  else {
                    (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                     .super__Vector_impl_data._M_start)->id = 2;
LAB_00927c47:
                    legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_start =
                         legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                         _M_impl.super__Vector_impl_data._M_start + 1;
                  }
                }
                else {
                  pEVar26 = (Expression *)
                            MixedArena::allocSpace((MixedArena *)(local_80._M_pi + 0x20),0x18,8);
                  pEVar26->_id = LocalGetId;
                  *(int *)(pEVar26 + 1) = (int)((ulong)((long)pTVar14 - (long)auVar35) >> 3);
                  (pEVar26->type).id = uVar4;
                  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )&value->name,pEVar26);
                  if (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                      _M_impl.super__Vector_impl_data._M_start !=
                      legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                     .super__Vector_impl_data._M_start)->id = pTVar25->id;
                    goto LAB_00927c47;
                  }
                  std::vector<wasm::Type,std::allocator<wasm::Type>>::
                  _M_realloc_insert<wasm::Type_const&>
                            ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_248,
                             (iterator)
                             legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                             ._M_impl.super__Vector_impl_data._M_start,pTVar25);
                }
                __dnew = __dnew + 1;
              } while ((__dnew != sVar24) || (auStack_58 != (undefined1  [8])auStack_f8));
            }
            SVar49 = HeapType::getSignature(pHVar41);
            TVar42.id = 2;
            if (SVar49.results.id.id != 3) {
              SVar49 = HeapType::getSignature(pHVar41);
              TVar42 = SVar49.results.id;
            }
            wasm::Type::Type((Type *)auStack_f8,(Tuple *)auStack_248);
            SVar49.results.id = TVar42.id;
            SVar49.params.id = (uintptr_t)auStack_f8;
            HeapType::HeapType((HeapType *)auStack_58,SVar49);
            (((Function *)pcVar23)->type).id = (uintptr_t)auStack_58;
            SVar49 = HeapType::getSignature(pHVar41);
            this_01 = value;
            if (SVar49.results.id.id == 3) {
              IVar19 = Builder::addVar((Builder *)pcVar23,(Function *)0x0,(Name)(ZEXT816(3) << 0x40)
                                       ,TVar38);
              pMVar43 = (MixedArena *)(local_80._M_pi + 0x20);
              this_01 = (Block *)MixedArena::allocSpace(pMVar43,0x40,8);
              (this_01->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id =
                   BlockId;
              (this_01->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id
                   = 0;
              (this_01->name).super_IString.str._M_len = 0;
              (this_01->name).super_IString.str._M_str = (char *)0x0;
              (this_01->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
                   (Expression **)0x0;
              (this_01->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements = 0;
              (this_01->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              allocatedElements = 0;
              (this_01->list).allocator = pMVar43;
              item = Builder::makeLocalSet
                               ((Builder *)&stack0xffffffffffffff80,IVar19,(Expression *)value);
              this_02 = &this_01->list;
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        (&this_02->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(Expression *)item);
              if (this->setTempRet0 == (Function *)0x0) {
                if (this->exportedHelpers == true) {
                  name.super_IString.str._M_str = _ZN4wasm12_GLOBAL__N_119SET_TEMP_RET_EXPORTE_1;
                  name.super_IString.str._M_len = _ZN4wasm12_GLOBAL__N_119SET_TEMP_RET_EXPORTE_0;
                  pEVar27 = Module::getExport((Module *)local_70._16_8_,name);
                  pcVar34 = (char *)0x0;
                  sVar24 = 0;
                  if (pEVar27->kind == Function) {
                    pvVar33 = &pEVar27->value;
                    if (*(__index_type *)
                         ((long)&(pEVar27->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                                 super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                                 super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                                 super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                                 super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                                 super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) !=
                        '\0') {
                      pvVar33 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
                    }
                    sVar24 = *(size_t *)
                              &(pvVar33->super__Variant_base<wasm::Name,_wasm::HeapType>).
                               super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                               super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                               super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                               super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                               super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u;
                    pcVar34 = *(char **)((long)&(pvVar33->
                                                super__Variant_base<wasm::Name,_wasm::HeapType>).
                                                super__Move_assign_alias<wasm::Name,_wasm::HeapType>
                                                .
                                                super__Copy_assign_alias<wasm::Name,_wasm::HeapType>
                                                .super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                                                super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                                                super__Variant_storage_alias<wasm::Name,_wasm::HeapType>
                                                ._M_u + 8);
                  }
                  name_00.super_IString.str._M_str = pcVar34;
                  name_00.super_IString.str._M_len = sVar24;
                  pFVar22 = Module::getFunction((Module *)local_70._16_8_,name_00);
                }
                else {
                  name_05.super_IString.str._M_str = (char *)0x2;
                  name_05.super_IString.str._M_len = _ZN4wasm12_GLOBAL__N_119SET_TEMP_RET_IMPORTE_1;
                  pFVar22 = getFunctionOrImport((LegalizeJSInterface *)local_70._16_8_,
                                                _ZN4wasm12_GLOBAL__N_119SET_TEMP_RET_IMPORTE_0,
                                                name_05,(Type)0x0,in_R9);
                }
                this->setTempRet0 = pFVar22;
              }
              sVar48 = (this->setTempRet0->super_Importable).super_Named.name.super_IString.str;
              local_98.id = (uintptr_t)
                            I64Utilities::getI64High((Builder *)&stack0xffffffffffffff80,IVar19);
              __l._M_len = 1;
              __l._M_array = (iterator)&local_98;
              std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                        ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         auStack_58,__l,(allocator_type *)&builder_1);
              in_R9.id = 0;
              pCVar28 = Builder::makeCall((Builder *)&stack0xffffffffffffff80,(Name)sVar48,
                                          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                           *)auStack_58,(Type)0x0,false);
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        (&this_02->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,(Expression *)pCVar28);
              if (auStack_58 != (undefined1  [8])0x0) {
                operator_delete((void *)auStack_58,local_48._M_len - (long)auStack_58);
              }
              pEVar26 = I64Utilities::getI64Low((Builder *)&stack0xffffffffffffff80,IVar19);
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        (&this_02->
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,pEVar26);
              type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._8_8_ = 0;
              type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Type>._M_payload =
                   (_Storage<wasm::Type,_true>)pEVar26;
              Block::finalize(this_01,type_,Unknown);
            }
            ((Function *)pcVar23)->body = (Expression *)this_01;
            pFVar22 = Module::addFunction((Module *)local_70._16_8_,(Function *)pcVar23);
            sVar50 = (pFVar22->super_Importable).super_Named.name.super_IString.str;
            sVar48 = (pFVar22->super_Importable).super_Named.name.super_IString.str;
            if (auStack_248 != (undefined1  [8])0x0) {
              pcVar23 = (char *)((long)legalParams.
                                       super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)auStack_248
                                );
              operator_delete((void *)auStack_248,(ulong)pcVar23);
              sVar48 = sVar50;
            }
          }
          *local_100 = sVar48;
          module = (Module *)local_70._16_8_;
          if ((bVar17) &&
             ((pFVar20->super_Importable).module.super_IString.str._M_str == (char *)0x0)) {
            auStack_248 = (undefined1  [8])
                          **(size_t **)
                            stub._M_t.
                            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                            .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
            legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)(*(size_t **)
                            stub._M_t.
                            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                            .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)[1];
            pcVar23 = "dynCall_";
            bVar18 = IString::startsWith<9>((IString *)auStack_248,(char (*) [9])"dynCall_");
            module = (Module *)local_70._16_8_;
            if (!bVar18) {
              __dnew = 5;
              local_48._M_len = CONCAT26(local_48._M_len._6_2_,0x246769726f);
              lVar5 = (*(long **)stub._M_t.
                                 super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                 .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)[1];
              local_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70;
              auStack_58 = (undefined1  [8])&local_48;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&stack0xffffffffffffff80,lVar5,
                         **(long **)stub._M_t.
                                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                    .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl +
                         lVar5);
              puVar37 = (pointer)0xf;
              if (auStack_58 != (undefined1  [8])&local_48) {
                puVar37 = (pointer)local_48._M_len;
              }
              puVar3 = (pointer)((long)&((builder.wasm)->exports).
                                        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + __dnew);
              if (puVar37 < puVar3) {
                puVar37 = (pointer)0xf;
                if ((Module *)local_80._M_pi != (Module *)local_70) {
                  puVar37 = (pointer)local_70._0_8_;
                }
                if (puVar37 < puVar3) goto LAB_00927fe6;
                puVar29 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&stack0xffffffffffffff80,0,(char *)0x0,(ulong)auStack_58
                                    );
              }
              else {
LAB_00927fe6:
                puVar29 = (undefined8 *)
                          std::__cxx11::string::_M_append(auStack_58,(ulong)local_80._M_pi);
              }
              auStack_248 = (undefined1  [8])
                            &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
              puVar1 = puVar29 + 2;
              if ((pointer *)*puVar29 == (pointer *)puVar1) {
                legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)*puVar1;
                legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)puVar29[3];
              }
              else {
                legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)*puVar1;
                auStack_248 = (undefined1  [8])*puVar29;
              }
              legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)puVar29[1];
              *puVar29 = puVar1;
              puVar29[1] = 0;
              *(undefined1 *)puVar1 = 0;
              sVar50._M_str = (char *)0x0;
              sVar50._M_len = (size_t)auStack_248;
              sVar48 = IString::interned((IString *)
                                         legalParams.
                                         super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                         ._M_impl.super__Vector_impl_data._M_start,sVar50,
                                         SUB81(puVar1,0));
              if (auStack_248 !=
                  (undefined1  [8])
                  &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
                operator_delete((void *)auStack_248,
                                (ulong)((long)&(legalParams.
                                                super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                                ._M_impl.super__Vector_impl_data._M_finish)->id + 1)
                               );
              }
              if ((Module *)local_80._M_pi != (Module *)local_70) {
                operator_delete(local_80._M_pi,
                                (ulong)((long)&(((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>
                                                  *)local_70._0_8_)->
                                               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                               )._M_t.
                                               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                               .super__Head_base<0UL,_wasm::Export_*,_false>.
                                               _M_head_impl + 1));
              }
              if (auStack_58 != (undefined1  [8])&local_48) {
                operator_delete((void *)auStack_58,
                                (ulong)((long)&(((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>
                                                  *)local_48._M_len)->
                                               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                               )._M_t.
                                               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                               .super__Head_base<0UL,_wasm::Export_*,_false>.
                                               _M_head_impl + 1));
              }
              auStack_248 = (undefined1  [8])
                            (pFVar20->super_Importable).super_Named.name.super_IString.str._M_len;
              legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)(pFVar20->super_Importable).super_Named.name.super_IString.str._M_str;
              auStack_58 = (undefined1  [8])operator_new(0x30);
              ((string_view *)((long)auStack_58 + 0x10))->_M_str = (char *)auStack_248;
              ((string_view *)((long)auStack_58 + 0x20))->_M_len =
                   (size_t)legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                           _M_impl.super__Vector_impl_data._M_start;
              *(string_view *)auStack_58 = sVar48;
              *(undefined4 *)&((string_view *)((long)auStack_58 + 0x10))->_M_len = 0;
              *(undefined1 *)&((string_view *)((long)auStack_58 + 0x20))->_M_str = 0;
              pcVar23 = auStack_58;
              std::
              vector<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>,std::allocator<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>>>
              ::emplace_back<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>>
                        ((vector<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>,std::allocator<std::unique_ptr<wasm::Export,std::default_delete<wasm::Export>>>>
                          *)auStack_268,
                         (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)pcVar23);
              module = (Module *)local_70._16_8_;
              if (auStack_58 != (undefined1  [8])0x0) {
                pcVar23 = &DAT_00000030;
                operator_delete((void *)auStack_58,0x30);
              }
            }
          }
        }
      }
      _Var30._M_head_impl =
           (Function *)
           ((long)stub._M_t.
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8);
      auVar35 = auStack_268;
      pFVar20 = (Function *)
                newExports.
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (_Var30._M_head_impl !=
             (Function *)
             originalFunctions.
             super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  }
  for (; auVar35 != (undefined1  [8])pFVar20;
      auVar35 = (undefined1  [8])
                &(((Function *)auVar35)->super_Importable).super_Named.name.super_IString.str._M_str
      ) {
    pcVar23 = (char *)auVar35;
    Module::addExport((Module *)local_70._16_8_,
                      (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)auVar35);
  }
  auStack_f8 = (undefined1  [8])0x0;
  originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar47 = (((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               *)(local_70._16_8_ + 0x18))->
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              *)(local_70._16_8_ + 0x18))->
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar47 != puVar6) {
    do {
      auStack_248 = (undefined1  [8])
                    (puVar47->_M_t).
                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t
                    .super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      pcVar23 = (char *)auStack_248;
      std::vector<wasm::Function*,std::allocator<wasm::Function*>>::emplace_back<wasm::Function*>
                ((vector<wasm::Function*,std::allocator<wasm::Function*>> *)auStack_f8,
                 (Function **)auStack_248);
      puVar47 = puVar47 + 1;
    } while (puVar47 != puVar6);
  }
  ppFVar15 = originalFunctions.
             super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  pMVar31 = (Module *)local_70._16_8_;
  if (auStack_f8 !=
      (undefined1  [8])
      originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    ppFVar2 = &this->getTempRet0;
    pMVar43 = (MixedArena *)(local_70._16_8_ + 0x200);
    auVar35 = auStack_f8;
    do {
      stub._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
      super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
           (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
           ((string_view *)auVar35)->_M_len;
      if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)stub._M_t.
                      super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                      .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20))->
           _M_allocated_capacity != 0) &&
         (bVar17 = isIllegal<wasm::Function>
                             ((LegalizeJSInterface *)
                              stub._M_t.
                              super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                              .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                              (Function *)pcVar23), bVar17)) {
        local_100 = (string_view *)auVar35;
        local_98.id = (uintptr_t)pMVar31;
        pMVar31 = (Module *)operator_new(0x1d8);
        memset(pMVar31,0,0x1d8);
        HeapType::HeapType((HeapType *)
                           &(pMVar31->globals).
                            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,(Signature)ZEXT816(0));
        _Var16 = stub;
        *(undefined4 *)
         &(pMVar31->globals).
          super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = 0;
        (pMVar31->tags).
        super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pMVar31->tags).
        super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pMVar31->tags).
        super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pMVar31->elementSegments).
        super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pMVar31->elementSegments).
        super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)&(pMVar31->dataSegments).
                       super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
        (pMVar31->elementSegments).
        super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
        (pMVar31->memories).
        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pMVar31->memories).
        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        *(undefined4 *)
         &(pMVar31->memories).
          super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = 0x3f800000;
        (pMVar31->dataSegments).
        super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pMVar31->dataSegments).
        super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pMVar31->dataSegments).
        super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&pMVar31->customSections;
        (pMVar31->tables).
        super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
        (pMVar31->tables).
        super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pMVar31->tables).
        super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        *(undefined4 *)&(pMVar31->start).super_IString.str._M_len = 0x3f800000;
        (pMVar31->start).super_IString.str._M_str = (char *)0x0;
        (pMVar31->customSections).
        super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pMVar31->customSections).
        super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&pMVar31->debugInfoSymbolNames;
        (pMVar31->customSections).
        super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
        (pMVar31->dylinkSection)._M_t.
        super___uniq_ptr_impl<wasm::DylinkSection,_std::default_delete<wasm::DylinkSection>_>._M_t.
        super__Tuple_impl<0UL,_wasm::DylinkSection_*,_std::default_delete<wasm::DylinkSection>_>.
        super__Head_base<0UL,_wasm::DylinkSection_*,_false>._M_head_impl = (DylinkSection *)0x0;
        (pMVar31->debugInfoFileNames).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        *(undefined4 *)
         &(pMVar31->debugInfoFileNames).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = 0x3f800000;
        (pMVar31->debugInfoFileNames).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pMVar31->debugInfoSymbolNames).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        *(undefined1 *)((long)&(pMVar31->debugInfoSourceRoot)._M_dataplus._M_p + 4) = 0;
        (pMVar31->debugInfoSourceRoot).field_2._M_local_buf[0xc] = '\0';
        (pMVar31->debugInfoFile)._M_dataplus._M_p =
             (pointer)&(pMVar31->debugInfoSourcesContent).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (pMVar31->debugInfoFile)._M_string_length = 1;
        (pMVar31->debugInfoFile).field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(pMVar31->debugInfoFile).field_2 + 8) = 0;
        *(undefined4 *)
         &(pMVar31->debugInfoSourcesContent).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = 0x3f800000;
        (pMVar31->debugInfoSourcesContent).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pMVar31->debugInfoSourcesContent).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        *(size_type **)&pMVar31->features = &(pMVar31->typeNames)._M_h._M_element_count;
        (pMVar31->name).super_IString.str._M_len = 1;
        (pMVar31->name).super_IString.str._M_str = (char *)0x0;
        (pMVar31->typeNames)._M_h._M_buckets = (__buckets_ptr)0x0;
        *(undefined4 *)&(pMVar31->typeNames)._M_h._M_bucket_count = 0x3f800000;
        *(undefined8 *)((long)&(pMVar31->typeNames)._M_h._M_element_count + 4) = 0;
        *(undefined8 *)&(pMVar31->typeNames)._M_h._M_rehash_policy.field_0x4 = 0;
        (pMVar31->typeNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        (pMVar31->typeNames)._M_h._M_element_count = 0;
        (pMVar31->typeNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
        (pMVar31->typeIndices)._M_h._M_buckets = (__buckets_ptr)0x0;
        *(undefined2 *)&(pMVar31->typeIndices)._M_h._M_bucket_count = 0;
        local_48._M_len = 0x706d696c6167656c;
        local_48._M_str._0_4_ = 0x2474726f;
        __dnew = 0xc;
        local_48._M_str._4_1_ = 0;
        local_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70;
        builder_1.wasm = pMVar31;
        auStack_58 = (undefined1  [8])&local_48;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xffffffffffffff80,
                   *(long *)((long)stub._M_t.
                                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                   .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8)
                   ,*(long *)stub._M_t.
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl +
                    *(long *)((long)stub._M_t.
                                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                    .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8
                             ));
        puVar37 = (pointer)0xf;
        if (auStack_58 != (undefined1  [8])&local_48) {
          puVar37 = (pointer)local_48._M_len;
        }
        puVar3 = (pointer)((long)&((builder.wasm)->exports).
                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + __dnew);
        if (puVar37 < puVar3) {
          puVar37 = (pointer)0xf;
          if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70) {
            puVar37 = (pointer)local_70._0_8_;
          }
          if (puVar37 < puVar3) goto LAB_009283f6;
          puVar29 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&stack0xffffffffffffff80,0,(char *)0x0,(ulong)auStack_58);
        }
        else {
LAB_009283f6:
          puVar29 = (undefined8 *)std::__cxx11::string::_M_append(auStack_58,(ulong)local_80._M_pi);
        }
        auStack_248 = (undefined1  [8])
                      &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
        puVar1 = puVar29 + 2;
        if ((pointer *)*puVar29 == (pointer *)puVar1) {
          legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)*puVar1;
          legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)puVar29[3];
        }
        else {
          legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)*puVar1;
          auStack_248 = (undefined1  [8])*puVar29;
        }
        legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)puVar29[1];
        *puVar29 = puVar1;
        puVar29[1] = 0;
        *(undefined1 *)puVar1 = 0;
        s._M_str = (char *)0x0;
        s._M_len = (size_t)auStack_248;
        sVar48 = IString::interned((IString *)
                                   legalParams.
                                   super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_start,s,SUB81(puVar1,0));
        ((builder_1.wasm)->exports).
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)sVar48._M_len;
        ((builder_1.wasm)->exports).
        super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)sVar48._M_str;
        if (auStack_248 !=
            (undefined1  [8])
            &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          operator_delete((void *)auStack_248,
                          (ulong)((long)&(legalParams.
                                          super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                          ._M_impl.super__Vector_impl_data._M_finish)->id + 1));
        }
        if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70) {
          operator_delete(local_80._M_pi,
                          (ulong)((long)&(((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>
                                            *)local_70._0_8_)->
                                         super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                         )._M_t.
                                         super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                         .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl
                                 + 1));
        }
        if (auStack_58 != (undefined1  [8])&local_48) {
          operator_delete((void *)auStack_58,
                          (ulong)((long)&(((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>
                                            *)local_48._M_len)->
                                         super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                         )._M_t.
                                         super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                         .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl
                                 + 1));
        }
        puVar47 = *(pointer *)
                   ((long)_Var16._M_t.
                          super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                          .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20);
        ((builder_1.wasm)->functions).
        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             *(pointer *)
              ((long)_Var16._M_t.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x18);
        ((builder_1.wasm)->functions).
        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar47;
        puVar45 = *(pointer *)
                   ((long)_Var16._M_t.
                          super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                          .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x30);
        ((builder_1.wasm)->functions).
        super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)
              ((long)_Var16._M_t.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x28);
        ((builder_1.wasm)->globals).
        super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = puVar45;
        *(undefined1 *)
         &((builder_1.wasm)->exports).
          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = 1;
        __s = (mapped_type)operator_new(0x1d8);
        memset(__s,0,0x1d8);
        HeapType::HeapType(&__s->type,(Signature)ZEXT816(0));
        _Var16 = stub;
        __s->profile = Normal;
        (__s->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__s->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__s->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        __s->body = (Expression *)0x0;
        (__s->localNames)._M_h._M_buckets = &(__s->localNames)._M_h._M_single_bucket;
        (__s->localNames)._M_h._M_bucket_count = 1;
        (__s->localNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        (__s->localNames)._M_h._M_element_count = 0;
        (__s->localNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        (__s->localNames)._M_h._M_rehash_policy._M_next_resize = 0;
        (__s->localNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
        (__s->localIndices)._M_h._M_buckets = &(__s->localIndices)._M_h._M_single_bucket;
        (__s->localIndices)._M_h._M_bucket_count = 1;
        (__s->localIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        (__s->localIndices)._M_h._M_element_count = 0;
        (__s->localIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        (__s->localIndices)._M_h._M_rehash_policy._M_next_resize = 0;
        (__s->localIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
        (__s->debugLocations)._M_h._M_buckets = &(__s->debugLocations)._M_h._M_single_bucket;
        (__s->debugLocations)._M_h._M_bucket_count = 1;
        (__s->debugLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        (__s->debugLocations)._M_h._M_element_count = 0;
        (__s->debugLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        (__s->debugLocations)._M_h._M_rehash_policy._M_next_resize = 0;
        (__s->debugLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
        (__s->prologLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
        _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
        (__s->epilogLocation).super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
        _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_engaged = false;
        (__s->expressionLocations)._M_h._M_buckets =
             &(__s->expressionLocations)._M_h._M_single_bucket;
        (__s->expressionLocations)._M_h._M_bucket_count = 1;
        (__s->expressionLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        (__s->expressionLocations)._M_h._M_element_count = 0;
        (__s->expressionLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        (__s->expressionLocations)._M_h._M_rehash_policy._M_next_resize = 0;
        (__s->expressionLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
        (__s->delimiterLocations)._M_h._M_buckets = &(__s->delimiterLocations)._M_h._M_single_bucket
        ;
        (__s->delimiterLocations)._M_h._M_bucket_count = 1;
        (__s->delimiterLocations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        (__s->delimiterLocations)._M_h._M_element_count = 0;
        (__s->delimiterLocations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        *(undefined8 *)((long)&(__s->delimiterLocations)._M_h._M_single_bucket + 4) = 0;
        (__s->funcLocation).declarations = 0;
        (__s->funcLocation).end = 0;
        (__s->delimiterLocations)._M_h._M_rehash_policy._M_next_resize = 0;
        (__s->delimiterLocations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
        (__s->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (__s->effects).super___shared_ptr<wasm::EffectAnalyzer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        __s->noFullInline = false;
        __s->noPartialInline = false;
        local_48._M_len = 0x6e75666c6167656c;
        __dnew = 10;
        local_48._M_str._0_4_ = CONCAT13(local_48._M_str._3_1_,0x2463);
        local_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70;
        local_a8._M_head_impl = __s;
        auStack_58 = (undefined1  [8])&local_48;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xffffffffffffff80,
                   *(long *)((long)stub._M_t.
                                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                   .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8)
                   ,*(long *)stub._M_t.
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl +
                    *(long *)((long)stub._M_t.
                                    super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                    .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 8
                             ));
        puVar37 = (pointer)0xf;
        if (auStack_58 != (undefined1  [8])&local_48) {
          puVar37 = (pointer)local_48._M_len;
        }
        puVar3 = (pointer)((long)&((builder.wasm)->exports).
                                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + __dnew);
        if (puVar37 < puVar3) {
          puVar37 = (pointer)0xf;
          if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70) {
            puVar37 = (pointer)local_70._0_8_;
          }
          if (puVar37 < puVar3) goto LAB_009286aa;
          puVar29 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&stack0xffffffffffffff80,0,(char *)0x0,(ulong)auStack_58);
        }
        else {
LAB_009286aa:
          puVar29 = (undefined8 *)std::__cxx11::string::_M_append(auStack_58,(ulong)local_80._M_pi);
        }
        auStack_248 = (undefined1  [8])
                      &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
        puVar1 = puVar29 + 2;
        if ((pointer *)*puVar29 == (pointer *)puVar1) {
          legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)*puVar1;
          legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)puVar29[3];
        }
        else {
          legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)*puVar1;
          auStack_248 = (undefined1  [8])*puVar29;
        }
        legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)puVar29[1];
        *puVar29 = puVar1;
        puVar29[1] = 0;
        *(undefined1 *)puVar1 = 0;
        s_00._M_str = (char *)0x0;
        s_00._M_len = (size_t)auStack_248;
        sVar48 = IString::interned((IString *)
                                   legalParams.
                                   super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_start,s_00,SUB81(puVar1,0));
        ((local_a8._M_head_impl)->super_Importable).super_Named.name.super_IString.str = sVar48;
        if (auStack_248 !=
            (undefined1  [8])
            &legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          operator_delete((void *)auStack_248,
                          (ulong)((long)&(legalParams.
                                          super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>
                                          ._M_impl.super__Vector_impl_data._M_finish)->id + 1));
        }
        if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70) {
          operator_delete(local_80._M_pi,
                          (ulong)((long)&(((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>
                                            *)local_70._0_8_)->
                                         super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                         )._M_t.
                                         super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                         .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl
                                 + 1));
        }
        if (auStack_58 != (undefined1  [8])&local_48) {
          operator_delete((void *)auStack_58,
                          (ulong)((long)&(((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>
                                            *)local_48._M_len)->
                                         super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                         )._M_t.
                                         super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                         .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl
                                 + 1));
        }
        ((local_a8._M_head_impl)->type).id =
             *(uintptr_t *)
              ((long)_Var16._M_t.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x38);
        ((local_a8._M_head_impl)->super_Importable).super_Named.hasExplicitName = true;
        originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)MixedArena::allocSpace(pMVar43,0x48,8);
        pHVar41 = (HeapType *)
                  ((long)_Var16._M_t.
                         super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                         .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x38);
        *(undefined1 *)
         originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage = 6;
        originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage[1] = (Function *)0x0;
        originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage[2] = (Function *)0x0;
        originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage[3] = (Function *)0x0;
        originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage[4] = (Function *)0x0;
        originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage[5] = (Function *)pMVar43;
        originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage[6] = (Function *)0x0;
        originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage[7] = (Function *)0x0;
        *(undefined1 *)
         (originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage + 8) = 0;
        pFVar20 = (Function *)
                  ((builder_1.wasm)->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage[6] =
             (Function *)
             ((builder_1.wasm)->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        originalFunctions.super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage[7] = pFVar20;
        auStack_248 = (undefined1  [8])0x0;
        legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        SVar49 = HeapType::getSignature(pHVar41);
        local_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)SVar49.params.id;
        __dnew = 0;
        auStack_58 = (undefined1  [8])&stack0xffffffffffffff80;
        sVar24 = wasm::Type::size((Type *)&stack0xffffffffffffff80);
        if ((__dnew != sVar24) || (auStack_58 != (undefined1  [8])&stack0xffffffffffffff80)) {
          this_00 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                    (originalFunctions.
                     super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 2);
          IVar19 = 0;
          do {
            pTVar25 = wasm::Type::Iterator::operator*((Iterator *)auStack_58);
            uVar4 = pTVar25->id;
            if (uVar4 == 3) {
              pEVar26 = I64Utilities::getI64Low((Builder *)&local_98,IVar19);
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        (this_00,pEVar26);
              pEVar26 = I64Utilities::getI64High((Builder *)&local_98,IVar19);
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        (this_00,pEVar26);
              local_108.id = 2;
              if (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                          ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_248,
                           (iterator)
                           legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                           _M_impl.super__Vector_impl_data._M_start,&local_108);
              }
              else {
                (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start)->id = 2;
                legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_start =
                     legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                     .super__Vector_impl_data._M_start + 1;
              }
              local_108.id = 2;
              if (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                          ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_248,
                           (iterator)
                           legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                           _M_impl.super__Vector_impl_data._M_start,&local_108);
              }
              else {
                (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start)->id = 2;
LAB_0092894f:
                legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                super__Vector_impl_data._M_start =
                     legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                     .super__Vector_impl_data._M_start + 1;
              }
            }
            else {
              pEVar26 = (Expression *)
                        MixedArena::allocSpace((MixedArena *)(local_98.id + 0x200),0x18,8);
              pEVar26->_id = LocalGetId;
              *(Index *)(pEVar26 + 1) = IVar19;
              (pEVar26->type).id = uVar4;
              ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                        (this_00,pEVar26);
              if (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                (legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start)->id = pTVar25->id;
                goto LAB_0092894f;
              }
              std::vector<wasm::Type,std::allocator<wasm::Type>>::
              _M_realloc_insert<wasm::Type_const&>
                        ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_248,
                         (iterator)
                         legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                         _M_impl.super__Vector_impl_data._M_start,pTVar25);
            }
            IVar19 = IVar19 + 1;
            __dnew = __dnew + 1;
          } while ((__dnew != sVar24) || (auStack_58 != (undefined1  [8])&stack0xffffffffffffff80));
        }
        SVar49 = HeapType::getSignature(pHVar41);
        pEVar26 = (Expression *)
                  originalFunctions.
                  super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        ppFVar44 = originalFunctions.
                   super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 1;
        if (SVar49.results.id.id == 3) {
          *ppFVar44 = (Function *)0x2;
          if (*ppFVar2 == (Function *)0x0) {
            if (this->exportedHelpers == true) {
              name_01.super_IString.str._M_str = _ZN4wasm12_GLOBAL__N_119GET_TEMP_RET_EXPORTE_1;
              name_01.super_IString.str._M_len = _ZN4wasm12_GLOBAL__N_119GET_TEMP_RET_EXPORTE_0;
              pEVar27 = Module::getExport((Module *)local_70._16_8_,name_01);
              pcVar23 = (char *)0x0;
              sVar24 = 0;
              if (pEVar27->kind == Function) {
                pvVar33 = &pEVar27->value;
                if (*(__index_type *)
                     ((long)&(pEVar27->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                             super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                             super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                             super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                             super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                             super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) !=
                    '\0') {
                  pvVar33 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
                }
                sVar24 = *(size_t *)
                          &(pvVar33->super__Variant_base<wasm::Name,_wasm::HeapType>).
                           super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                           super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                           super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                           super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                           super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u;
                pcVar23 = *(char **)((long)&(pvVar33->
                                            super__Variant_base<wasm::Name,_wasm::HeapType>).
                                            super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                                            super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                                            super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                                            super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                                            super__Variant_storage_alias<wasm::Name,_wasm::HeapType>
                                            ._M_u + 8);
              }
              name_02.super_IString.str._M_str = pcVar23;
              name_02.super_IString.str._M_len = sVar24;
              pFVar20 = Module::getFunction((Module *)local_70._16_8_,name_02);
            }
            else {
              name_06.super_IString.str._M_str = (char *)0x0;
              name_06.super_IString.str._M_len = _ZN4wasm12_GLOBAL__N_119GET_TEMP_RET_IMPORTE_1;
              pFVar20 = getFunctionOrImport((LegalizeJSInterface *)local_70._16_8_,
                                            _ZN4wasm12_GLOBAL__N_119GET_TEMP_RET_IMPORTE_0,name_06,
                                            (Type)0x2,in_R9);
            }
            *ppFVar2 = pFVar20;
          }
          auStack_58 = (undefined1  [8])0x0;
          __dnew = 0;
          local_48._M_len = 0;
          in_R9.id = 0;
          pCVar28 = Builder::makeCall((Builder *)&local_98,
                                      (Name)((*ppFVar2)->super_Importable).super_Named.name.
                                            super_IString.str,
                                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                       *)auStack_58,(Type)*ppFVar44,false);
          if (auStack_58 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_58,local_48._M_len - (long)auStack_58);
          }
          pEVar26 = I64Utilities::recreateI64((Builder *)&local_98,pEVar26,(Expression *)pCVar28);
        }
        else {
          SVar49 = HeapType::getSignature(pHVar41);
          *ppFVar44 = (Function *)SVar49.results.id.id;
        }
        (local_a8._M_head_impl)->body = pEVar26;
        wasm::Type::Type((Type *)&stack0xffffffffffffff80,(Tuple *)auStack_248);
        sig.results.id = (uintptr_t)*ppFVar44;
        sig.params.id = (uintptr_t)local_80._M_pi;
        HeapType::HeapType((HeapType *)auStack_58,sig);
        pMVar31 = (Module *)local_70._16_8_;
        _Var30._M_head_impl = local_a8._M_head_impl;
        ((builder_1.wasm)->globals).
        super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_58;
        pFVar20 = Module::getFunctionOrNull
                            ((Module *)local_70._16_8_,
                             (Name)((local_a8._M_head_impl)->super_Importable).super_Named.name.
                                   super_IString.str);
        if (pFVar20 == (Function *)0x0) {
          Module::addFunction(pMVar31,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                       *)&local_a8);
        }
        pFVar20 = Module::getFunctionOrNull
                            (pMVar31,(IString)*(IString *)
                                               &((builder_1.wasm)->exports).
                                                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                                ._M_impl.super__Vector_impl_data);
        if (pFVar20 == (Function *)0x0) {
          Module::addFunction(pMVar31,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                       *)&builder_1);
        }
        if (auStack_248 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_248,
                          (long)legalParams.
                                super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)auStack_248);
        }
        if (local_a8._M_head_impl != (Function *)0x0) {
          std::default_delete<wasm::Function>::operator()
                    ((default_delete<wasm::Function> *)&local_a8,local_a8._M_head_impl);
        }
        if (builder_1.wasm != (Module *)0x0) {
          std::default_delete<wasm::Function>::operator()
                    ((default_delete<wasm::Function> *)&builder_1,(Function *)builder_1.wasm);
        }
        pcVar23 = (char *)stub._M_t.
                          super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                          .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        ppFVar32 = std::__detail::
                   _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Function_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Function_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Function_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&this->illegalImportsToLegal,
                                (key_type *)
                                stub._M_t.
                                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        *ppFVar32 = _Var30._M_head_impl;
        auVar35 = (undefined1  [8])local_100;
      }
      auVar35 = (undefined1  [8])&((string_view *)auVar35)->_M_str;
    } while (auVar35 != (undefined1  [8])ppFVar15);
  }
  if ((this->illegalImportsToLegal)._M_h._M_element_count != 0) {
    local_120._8_8_ = &this->illegalImportsToLegal;
    legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_228;
    legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228[0]._M_local_buf[0] = '\0';
    local_1f8 = false;
    local_1f0._0_8_ = (pointer)0x0;
    local_1f0._8_8_ = (Expression *)0x0;
    local_1f0._176_8_ = (pointer)0x0;
    local_1f0._184_8_ = 0;
    local_1f0._192_8_ = 0;
    pFStack_128 = (Function *)0x0;
    local_120._0_8_ = 0;
    auStack_248 = (undefined1  [8])&PTR__WalkerPass_010934d0;
    legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(this->super_Pass).runner;
    WalkerPass<wasm::PostWalker<Fixer,_wasm::Visitor<Fixer,_void>_>_>::run
              ((WalkerPass<wasm::PostWalker<Fixer,_wasm::Visitor<Fixer,_void>_>_> *)auStack_248,
               pMVar31);
    pPVar7 = (this->super_Pass).runner;
    if ((PassRunner *)
        legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start != pPVar7 &&
        legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      __assert_fail("(!runner || runner == runner_) && \"Pass already had a runner\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                    ,0x1dd,"void wasm::Pass::setPassRunner(PassRunner *)");
    }
    puVar8 = (pMVar31->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    legalParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pPVar7;
    local_120._0_8_ = pMVar31;
    for (puVar45 = (pMVar31->globals).
                   super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar45 != puVar8;
        puVar45 = puVar45 + 1) {
      pGVar9 = (puVar45->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar9->super_Importable).module + 8) == (char *)0x0) {
        Walker<Fixer,_wasm::Visitor<Fixer,_void>_>::walk
                  ((Walker<Fixer,_wasm::Visitor<Fixer,_void>_> *)local_1f0,&pGVar9->init);
      }
    }
    _Var30._M_head_impl =
         (Function *)
         (((vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            *)(local_70._16_8_ + 0x60))->
         super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    stub._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (((vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            *)(local_70._16_8_ + 0x60))->
         super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if ((__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
        _Var30._M_head_impl !=
        (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)
        stub._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl) {
      do {
        _Var10._M_head_impl =
             (((__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
                *)&(_Var30._M_head_impl)->super_Importable)->
             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
             )._M_t.
             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        if ((_Var10._M_head_impl)->offset != (Expression *)0x0) {
          Walker<Fixer,_wasm::Visitor<Fixer,_void>_>::walk
                    ((Walker<Fixer,_wasm::Visitor<Fixer,_void>_> *)local_1f0,
                     &(_Var10._M_head_impl)->offset);
        }
        _Var10._M_head_impl =
             (((__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
                *)&(_Var30._M_head_impl)->super_Importable)->
             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
             )._M_t.
             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
             .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        ppEVar11 = *(pointer *)((long)&(_Var10._M_head_impl)->data + 8);
        for (ppEVar39 = *(pointer *)
                         &((_Var10._M_head_impl)->data).
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
            ; ppEVar39 != ppEVar11; ppEVar39 = ppEVar39 + 1) {
          auStack_58 = (undefined1  [8])*ppEVar39;
          Walker<Fixer,_wasm::Visitor<Fixer,_void>_>::walk
                    ((Walker<Fixer,_wasm::Visitor<Fixer,_void>_> *)local_1f0,
                     (Expression **)auStack_58);
        }
        _Var30._M_head_impl =
             (Function *)
             ((__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
               *)&(_Var30._M_head_impl)->super_Importable + 1);
      } while ((__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
               _Var30._M_head_impl !=
               (__uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>)
               stub._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
               ._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    }
    puVar12 = (((vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 *)(local_70._16_8_ + 0x90))->
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    for (puVar46 = (((vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                      *)(local_70._16_8_ + 0x90))->
                   super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; pMVar31 = (Module *)local_70._16_8_,
        puVar46 != puVar12; puVar46 = puVar46 + 1) {
      _Var13._M_head_impl =
           (puVar46->_M_t).
           super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
           super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
           super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
      if ((_Var13._M_head_impl)->offset != (Expression *)0x0) {
        Walker<Fixer,_wasm::Visitor<Fixer,_void>_>::walk
                  ((Walker<Fixer,_wasm::Visitor<Fixer,_void>_> *)local_1f0,
                   &(_Var13._M_head_impl)->offset);
      }
    }
    local_120._0_8_ = 0;
    p_Var36 = &(this->illegalImportsToLegal)._M_h._M_before_begin;
    while (p_Var36 = p_Var36->_M_nxt, p_Var36 != (__node_base *)0x0) {
      Module::removeFunction(pMVar31,(Name)*(string_view *)(p_Var36 + 1));
    }
    if ((pointer)local_1f0._176_8_ != (pointer)0x0) {
      operator_delete((void *)local_1f0._176_8_,local_1f0._192_8_ - local_1f0._176_8_);
    }
    Pass::~Pass((Pass *)auStack_248);
  }
  name_03.super_IString.str._M_str = _ZN4wasm12_GLOBAL__N_119GET_TEMP_RET_EXPORTE_1;
  name_03.super_IString.str._M_len = _ZN4wasm12_GLOBAL__N_119GET_TEMP_RET_EXPORTE_0;
  Module::removeExport(pMVar31,name_03);
  name_04.super_IString.str._M_str = _ZN4wasm12_GLOBAL__N_119SET_TEMP_RET_EXPORTE_1;
  name_04.super_IString.str._M_len = _ZN4wasm12_GLOBAL__N_119SET_TEMP_RET_EXPORTE_0;
  Module::removeExport(pMVar31,name_04);
  if (auStack_f8 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_f8,
                    (long)originalFunctions.
                          super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_f8);
  }
  std::
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ::~vector((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             *)auStack_268);
  return;
}

Assistant:

void run(Module* module) override {
    setTempRet0 = nullptr;
    getTempRet0 = nullptr;
    auto exportOriginals =
      hasArgument("legalize-js-interface-export-originals");
    exportedHelpers = hasArgument("legalize-js-interface-exported-helpers");
    // for each illegal export, we must export a legalized stub instead
    std::vector<std::unique_ptr<Export>> newExports;
    for (auto& ex : module->exports) {
      if (ex->kind == ExternalKind::Function) {
        // if it's an import, ignore it
        auto* name = ex->getInternalName();
        auto* func = module->getFunction(*name);
        if (isIllegal(func)) {
          // Provide a legal function for the export.
          auto legalName = makeLegalStub(func, module);
          *name = legalName;
          if (exportOriginals) {
            // Also export the original function, before legalization. This is
            // not normally useful for JS, except in cases like dynamic linking
            // where the JS loader code must copy exported wasm functions into
            // the table, and they must not be legalized as other wasm code will
            // do an indirect call to them. However, don't do this for imported
            // functions, as those would be legalized in their actual module
            // anyhow. It also makes no sense to do this for dynCalls, as they
            // are only called from JS.
            if (!func->imported() && !isDynCall(ex->name)) {
              Builder builder(*module);
              Name newName = std::string("orig$") + ex->name.toString();
              newExports.push_back(builder.makeExport(
                newName, func->name, ExternalKind::Function));
            }
          }
        }
      }
    }

    for (auto& ex : newExports) {
      module->addExport(std::move(ex));
    }
    // Avoid iterator invalidation later.
    std::vector<Function*> originalFunctions;
    for (auto& func : module->functions) {
      originalFunctions.push_back(func.get());
    }
    // for each illegal import, we must call a legalized stub instead
    for (auto* im : originalFunctions) {
      if (im->imported() && isIllegal(im)) {
        auto* func = makeLegalStubForCalledImport(im, module);
        illegalImportsToLegal[im->name] = func;
      }
    }

    if (!illegalImportsToLegal.empty()) {
      // fix up imports: call of an illegal import must be turned to a call of a
      // legal import. the same must be done with ref.funcs.
      struct Fixer : public WalkerPass<PostWalker<Fixer>> {
        bool isFunctionParallel() override { return true; }

        std::unique_ptr<Pass> create() override {
          return std::make_unique<Fixer>(illegalImportsToLegal);
        }

        std::unordered_map<Name, Function*>& illegalImportsToLegal;

        Fixer(std::unordered_map<Name, Function*>& illegalImportsToLegal)
          : illegalImportsToLegal(illegalImportsToLegal) {}

        void visitCall(Call* curr) {
          auto iter = illegalImportsToLegal.find(curr->target);
          if (iter == illegalImportsToLegal.end()) {
            return;
          }

          replaceCurrent(Builder(*getModule())
                           .makeCall(iter->second->name,
                                     curr->operands,
                                     curr->type,
                                     curr->isReturn));
        }

        void visitRefFunc(RefFunc* curr) {
          auto iter = illegalImportsToLegal.find(curr->func);
          if (iter == illegalImportsToLegal.end()) {
            return;
          }

          curr->func = iter->second->name;
          // TODO: Make this exact.
          curr->type = Type(iter->second->type, NonNullable);
        }
      };

      Fixer fixer(illegalImportsToLegal);
      fixer.run(getPassRunner(), module);
      fixer.runOnModuleCode(getPassRunner(), module);

      // Finally we can remove all the now-unused illegal imports
      for (const auto& pair : illegalImportsToLegal) {
        module->removeFunction(pair.first);
      }
    }

    module->removeExport(GET_TEMP_RET_EXPORT);
    module->removeExport(SET_TEMP_RET_EXPORT);
  }